

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O0

void __thiscall
ZAP::ArchiveBuilder::getFileMap
          (ArchiveBuilder *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map)

{
  bool bVar1;
  reference __args_1;
  Entry *entry;
  iterator __end1;
  iterator __begin1;
  FileList *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *map_local;
  ArchiveBuilder *this_local;
  
  __end1 = std::
           set<ZAP::ArchiveBuilder::Entry,_std::less<ZAP::ArchiveBuilder::Entry>,_std::allocator<ZAP::ArchiveBuilder::Entry>_>
           ::begin(&this->files);
  entry = (Entry *)std::
                   set<ZAP::ArchiveBuilder::Entry,_std::less<ZAP::ArchiveBuilder::Entry>,_std::allocator<ZAP::ArchiveBuilder::Entry>_>
                   ::end(&this->files);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&entry);
    if (!bVar1) break;
    __args_1 = std::_Rb_tree_const_iterator<ZAP::ArchiveBuilder::Entry>::operator*(&__end1);
    std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)map,&__args_1->virtual_path,&__args_1->real_path);
    std::_Rb_tree_const_iterator<ZAP::ArchiveBuilder::Entry>::operator++(&__end1);
  }
  return;
}

Assistant:

void ArchiveBuilder::getFileMap(std::map<std::string,std::string> &map) const
	{
		for (const Entry &entry : files)
		{
			map.emplace(entry.virtual_path, entry.real_path);
		}
	}